

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::accessChainGetLValue(Builder *this)

{
  Id IVar1;
  
  if ((this->accessChain).isRValue != false) {
    __assert_fail("accessChain.isRValue == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x9af,"Id spv::Builder::accessChainGetLValue()");
  }
  transferAccessChainSwizzle(this,true);
  IVar1 = collapseAccessChain(this);
  if ((this->accessChain).swizzle.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->accessChain).swizzle.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if ((this->accessChain).component == 0) {
      return IVar1;
    }
    __assert_fail("accessChain.component == NoResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x9b8,"Id spv::Builder::accessChainGetLValue()");
  }
  __assert_fail("accessChain.swizzle.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x9b7,"Id spv::Builder::accessChainGetLValue()");
}

Assistant:

Id Builder::accessChainGetLValue()
{
    assert(accessChain.isRValue == false);

    transferAccessChainSwizzle(true);
    Id lvalue = collapseAccessChain();

    // If swizzle exists, it is out-of-order or not full, we must load the target vector,
    // extract and insert elements to perform writeMask and/or swizzle.  This does not
    // go with getting a direct l-value pointer.
    assert(accessChain.swizzle.size() == 0);
    assert(accessChain.component == NoResult);

    return lvalue;
}